

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::ProgramBinarySimpleCase::test(ProgramBinarySimpleCase *this)

{
  string fragSrc;
  string vertSrc;
  ProgramBinary binary;
  ProgramSources sources;
  ShaderProgram program;
  string local_210;
  string local_1f0;
  ProgramBinary local_1d0;
  ProgramSources local_1b0;
  ShaderProgram local_e0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             (allocator<char> *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_fragColor;\nvoid main (void)\n{\n\to_fragColor = vec4(0.0);\n}\n"
             ,(allocator<char> *)&local_1b0);
  glu::makeVtxFragSources(&local_1b0,&local_1f0,&local_210);
  glu::ShaderProgram::ShaderProgram
            (&local_e0,((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx,
             &local_1b0);
  if (local_e0.m_program.m_info.linkOk == true) {
    local_1d0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ProgramBinaryCase::getProgramBinary
              (&this->super_ProgramBinaryCase,&local_1d0,local_e0.m_program.m_program);
    ProgramBinaryCase::verifyProgramBinary(&this->super_ProgramBinaryCase,&local_1d0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&local_1d0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  glu::ShaderProgram::~ShaderProgram(&local_e0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  return;
}

Assistant:

void test (void)
	{
		const std::string			vertSrc	= getSimpleShaderSource(glu::SHADERTYPE_VERTEX);
		const std::string			fragSrc	= getSimpleShaderSource(glu::SHADERTYPE_FRAGMENT);

		const glu::ProgramSources	sources	= glu::makeVtxFragSources(vertSrc, fragSrc);

		glu::ShaderProgram			program	(m_context.getRenderContext(), sources);

		if (program.isOk())
		{
			ProgramBinary binary;

			getProgramBinary(binary, program.getProgram());
			verifyProgramBinary(binary);
		}
	}